

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O3

bool ft::operator==(set<int,_ft::less<int>,_ft::allocator<int>_> *lhs,
                   set<int,_ft::less<int>,_ft::allocator<int>_> *rhs)

{
  bool bVar1;
  undefined **local_50;
  rbtree *local_48;
  treeNode<int> *local_40;
  undefined **local_38;
  rbtree *local_30;
  treeNode<int> *local_28;
  undefined **local_20;
  rbtree *local_18;
  treeNode<int> *local_10;
  
  if ((lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size ==
      (rhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size) {
    local_48 = &(lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
    local_28 = (lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
               super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last;
    local_40 = ((lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first)->
               parent;
    local_18 = &(rhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
    local_10 = ((rhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first)->
               parent;
    local_50 = &PTR__treeIterator_0010dcb8;
    local_38 = &PTR__treeIterator_0010dcb8;
    local_20 = &PTR__treeIterator_0010dcb8;
    local_30 = local_48;
    bVar1 = equal<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::equal_to<int>>
                      (&local_50,&local_38,&local_20,0,0);
    return bVar1;
  }
  return false;
}

Assistant:

size_type	size() const { return this->m_size; }